

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

string * __thiscall
dynet::PickElement::as_string
          (string *__return_storage_ptr__,PickElement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  ostream *poVar2;
  ulong uVar3;
  ostringstream s;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"pick(",5);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  local_1a1 = ',';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a1,1);
  if (this->pval == (uint *)0x0) {
    if (this->pvals == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                    ,0x281,
                    "virtual string dynet::PickElement::as_string(const vector<string> &) const");
    }
    local_1a1 = '[';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
    if ((this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      if (4 < (ulong)((long)(this->pvals->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this->pvals->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start)) {
        uVar3 = 1;
        do {
          local_1a1 = ',';
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a0,&local_1a1,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)((long)(this->pvals->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->pvals->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 2));
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"])",2);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    local_1a1 = ')';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a1,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string PickElement::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "pick(" << arg_names[0] << ',';
  if(pval) { 
    s << *pval << ')';
  } else {
    assert(pvals);
    s << '[';
    if(pvals->size()) {
      s << (*pvals)[0];
      for(size_t i = 1; i < pvals->size(); ++i)
        s << ',' << (*pvals)[i];
    }
    s << "])";
  }
  return s.str();
}